

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Wrapping_Not_Necessary_Or_Wrapping_Ok(FORM *form)

{
  int iVar1;
  FIELD *field;
  _Bool _Var2;
  int iVar3;
  char *txt;
  int iVar4;
  int iVar5;
  char *buf;
  
  field = form->current;
  iVar5 = 0;
  iVar4 = 0;
  if (((field->opts & 0x10) != 0) && ((int)field->rows + field->nrow != 1)) {
    iVar3 = field->drows;
    iVar1 = form->currow;
    _Var2 = Is_There_Room_For_A_Char_In_Line(form);
    iVar4 = iVar5;
    if (!_Var2) {
      if (iVar3 + -1 == iVar1) {
        if ((field->status & 8) == 0) {
          return 0;
        }
        _Var2 = Field_Grown(field,1);
        if (!_Var2) {
          return -1;
        }
      }
      buf = form->current->buf + (long)form->currow * (long)form->current->dcols;
      Window_To_Buffer(form->w,field);
      txt = After_Last_Whitespace_Character(buf,field->dcols);
      iVar5 = (int)txt - (int)buf;
      if (0 < iVar5) {
        iVar3 = Insert_String(form,form->currow + 1,txt,field->dcols - iVar5);
        if (iVar3 == 0) {
          wmove(form->w,form->currow,iVar5);
          wclrtoeol(form->w);
          if (iVar5 <= form->curcol) {
            form->currow = form->currow + 1;
            form->curcol = form->curcol - iVar5;
          }
        }
        else {
          wmove(form->w,form->currow,form->curcol);
          wdelch(form->w);
          Window_To_Buffer(form->w,field);
          iVar4 = -0xc;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int Wrapping_Not_Necessary_Or_Wrapping_Ok(FORM * form)
{
  FIELD  *field = form->current;
  int result = E_REQUEST_DENIED;
  bool Last_Row = ((field->drows - 1) == form->currow);

  if ( (field->opts & O_WRAP)                     &&  /* wrapping wanted     */
      (!Single_Line_Field(field))                 &&  /* must be multi-line  */
      (There_Is_No_Room_For_A_Char_In_Line(form)) &&  /* line is full        */
      (!Last_Row || Growable(field))               )  /* there are more lines*/
    {
      char *bp;
      char *split;
      int chars_to_be_wrapped;
      int chars_to_remain_on_line;
      if (Last_Row)
        { /* the above logic already ensures, that in this case the field
             is growable */
          if (!Field_Grown(field,1))
            return E_SYSTEM_ERROR;
        }
      bp = Address_Of_Current_Row_In_Buffer(form);
      Window_To_Buffer(form->w,field);
      split = After_Last_Whitespace_Character(bp,field->dcols);
      /* split points to the first character of the sequence to be brought
         on the next line */
      chars_to_remain_on_line = (int)(split - bp);
      chars_to_be_wrapped     = field->dcols - chars_to_remain_on_line;
      if (chars_to_remain_on_line > 0)
        {
          if ((result=Insert_String(form,form->currow+1,split,
                                    chars_to_be_wrapped)) == E_OK)
            {
              wmove(form->w,form->currow,chars_to_remain_on_line);
              wclrtoeol(form->w);
              if (form->curcol >= chars_to_remain_on_line)
                {
                  form->currow++;
                  form->curcol -= chars_to_remain_on_line;
                }
              return E_OK;
            }
        }
      else
        return E_OK;
      if (result!=E_OK)
        {
          wmove(form->w,form->currow,form->curcol);
          wdelch(form->w);
          Window_To_Buffer(form->w,field);
          result = E_REQUEST_DENIED;
        }
    }
  else
    result = E_OK; /* wrapping was not necessary */
  return(result);
}